

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<int,_allocator_default<int>_>::clear(array<int,_allocator_default<int>_> *this)

{
  int *piVar1;
  int *in_RDI;
  
  allocator_default<int>::free_array(in_RDI);
  in_RDI[2] = 1;
  piVar1 = allocator_default<int>::alloc_array(0);
  *(int **)in_RDI = piVar1;
  in_RDI[3] = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}